

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SolverTypes.h
# Opt level: O0

CRef __thiscall
Glucose::ClauseAllocator::alloc<Glucose::Clause>
          (ClauseAllocator *this,Clause *ps,bool learnt,bool imported)

{
  bool bVar1;
  byte bVar2;
  int size;
  Ref _extra_size;
  byte in_CL;
  byte bVar3;
  byte in_DL;
  Clause *in_RSI;
  long in_RDI;
  undefined1 uVar4;
  CRef cid;
  int extra_size;
  bool use_extra;
  Ref in_stack_ffffffffffffffcc;
  undefined4 in_stack_ffffffffffffffd0;
  uint uVar5;
  undefined1 in_stack_ffffffffffffffe3;
  uint extra_size_00;
  undefined1 in_stack_ffffffffffffffec;
  
  bVar3 = in_DL & 1;
  bVar2 = in_CL & 1;
  bVar1 = (*(byte *)(in_RDI + 0x14) & 1) != 0;
  uVar4 = bVar3 != 0 || bVar1;
  if (bVar2 == 0) {
    uVar5 = (uint)(bVar3 != 0 || bVar1);
  }
  else {
    uVar5 = 3;
  }
  extra_size_00 = uVar5;
  size = Clause::size(in_RSI);
  clauseWord32Size(size,extra_size_00);
  _extra_size = RegionAllocator<unsigned_int>::alloc
                          ((RegionAllocator<unsigned_int> *)
                           CONCAT44(uVar5,in_stack_ffffffffffffffd0),in_stack_ffffffffffffffcc);
  lea((ClauseAllocator *)CONCAT44(uVar5,in_stack_ffffffffffffffd0),in_stack_ffffffffffffffcc);
  Clause::Clause<Glucose::Clause>
            (in_RSI,(Clause *)
                    CONCAT17(bVar3,CONCAT16(bVar2,CONCAT15(uVar4,CONCAT14(in_stack_ffffffffffffffec,
                                                                          extra_size_00)))),
             _extra_size,(bool)in_stack_ffffffffffffffe3);
  return _extra_size;
}

Assistant:

CRef alloc(const Lits& ps, bool learnt = false, bool imported = false)
        {
            assert(sizeof(Lit)      == sizeof(uint32_t));
            assert(sizeof(float)    == sizeof(uint32_t));

            bool use_extra = learnt | extra_clause_field;
            int extra_size = imported?3:(use_extra?1:0);
            CRef cid = RegionAllocator<uint32_t>::alloc(clauseWord32Size(ps.size(), extra_size));
            new (lea(cid)) Clause(ps, extra_size, learnt);

            return cid;
        }